

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm_test.cpp
# Opt level: O0

pint p_test_case_pshm_thread_test(void)

{
  bool bVar1;
  int iVar2;
  pint pVar3;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int local_3c;
  int i;
  pboolean test_ok;
  pint val;
  ppointer addr;
  PUThread *thr3;
  PUThread *thr2;
  PUThread *thr1;
  PShm *shm;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  lVar5 = p_shm_new("p_shm_test_memory_block",0x100000,1,0);
  if (lVar5 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x101);
    exit(-1);
  }
  p_shm_take_ownership(lVar5);
  p_shm_free(lVar5);
  thr1 = (PUThread *)p_shm_new("p_shm_test_memory_block",0x100000,1,0);
  if (thr1 == (PUThread *)0x0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x106);
    exit(-1);
  }
  lVar5 = p_shm_get_size(thr1);
  if (lVar5 != 0x100000) {
    p_shm_free(thr1);
    thr1 = (PUThread *)p_shm_new("p_shm_test_memory_block",0x100000,1,0);
    if (thr1 == (PUThread *)0x0) {
      printf("%s:%d: required check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
             ,0x10b);
      exit(-1);
    }
  }
  lVar5 = p_shm_get_size(thr1);
  if (lVar5 != 0x100000) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x10e);
    exit(-1);
  }
  pcVar6 = (char *)p_shm_get_address(thr1);
  if (pcVar6 == (char *)0x0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x111);
    exit(-1);
  }
  lVar5 = p_uthread_create(shm_test_thread,thr1,1,0);
  if (lVar5 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x114);
    exit(-1);
  }
  lVar7 = p_uthread_create(shm_test_thread,thr1,1,0);
  if (lVar7 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x117);
    exit(-1);
  }
  lVar8 = p_uthread_create(shm_test_thread,thr1,1);
  if (lVar8 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x11a);
    exit(-1);
  }
  iVar2 = p_uthread_join(lVar5);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x11c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_uthread_join(lVar7);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x11d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_uthread_join(lVar8);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
           ,0x11e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  bVar1 = true;
  local_3c = 1;
  do {
    if (0xfffff < local_3c) {
LAB_001020a7:
      if (bVar1) {
        p_uthread_unref(lVar5);
        p_uthread_unref(lVar7);
        p_uthread_unref(lVar8);
        p_shm_free(thr1);
        p_libsys_shutdown();
        pVar3 = -1;
        if (p_test_module_fail_counter == 0) {
          pVar3 = 0;
        }
        return pVar3;
      }
      printf("%s:%d: required check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pshm_test.cpp"
             ,0x129);
      exit(-1);
    }
    if (pcVar6[local_3c] != *pcVar6) {
      bVar1 = false;
      goto LAB_001020a7;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

P_TEST_CASE_BEGIN (pshm_thread_test)
{
	PShm		*shm;
	PUThread	*thr1;
	PUThread	*thr2;
	PUThread	*thr3;
	ppointer	addr;
	pint		val;
	pboolean	test_ok;

	p_libsys_init ();

	srand ((puint) time (NULL));

	shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
	P_TEST_REQUIRE (shm != NULL);
	p_shm_take_ownership (shm);
	p_shm_free (shm);

	shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
	P_TEST_REQUIRE (shm != NULL);

	if (p_shm_get_size (shm) != 1024 * 1024) {
		p_shm_free (shm);
		shm = p_shm_new ("p_shm_test_memory_block", 1024 * 1024, P_SHM_ACCESS_READWRITE, NULL);
		P_TEST_REQUIRE (shm != NULL);
	}

	P_TEST_REQUIRE (p_shm_get_size (shm) == 1024 * 1024);

	addr = p_shm_get_address (shm);
	P_TEST_REQUIRE (addr != NULL);

	thr1 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr1 != NULL);

	thr2 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr2 != NULL);

	thr3 = p_uthread_create ((PUThreadFunc) shm_test_thread, (ppointer) shm, TRUE, NULL);
	P_TEST_REQUIRE (thr3 != NULL);

	P_TEST_CHECK (p_uthread_join (thr1) == 0);
	P_TEST_CHECK (p_uthread_join (thr2) == 0);
	P_TEST_CHECK (p_uthread_join (thr3) == 0);

	test_ok = TRUE;
	val = *((pchar *) addr);

	for (int i = 1; i < 1024 * 1024; ++i)
		if (*(((pchar *) addr) + i) != val) {
			test_ok = FALSE;
			break;
		}

	P_TEST_REQUIRE (test_ok == TRUE);

	p_uthread_unref (thr1);
	p_uthread_unref (thr2);
	p_uthread_unref (thr3);
	p_shm_free (shm);

	p_libsys_shutdown ();
}